

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DnsStats.cpp
# Opt level: O0

uint32_t __thiscall
DnsStats::SkipDnsName(DnsStats *this,uint8_t *packet,uint32_t length,uint32_t start)

{
  uint uVar1;
  uint local_20;
  uint32_t l;
  uint32_t start_local;
  uint32_t length_local;
  uint8_t *packet_local;
  DnsStats *this_local;
  
  local_20 = start;
  while( true ) {
    if (length <= local_20) {
      return local_20;
    }
    uVar1 = (uint)packet[local_20];
    if (uVar1 == 0) {
      return local_20 + 1;
    }
    if ((uVar1 & 0xc0) == 0xc0) {
      if (length < local_20 + 2) {
        return length;
      }
      return local_20 + 2;
    }
    if (0x3f < uVar1) break;
    if (length < local_20 + uVar1 + 1) {
      return length;
    }
    local_20 = uVar1 + 1 + local_20;
  }
  return length;
}

Assistant:

uint32_t DnsStats::SkipDnsName(uint8_t* packet, uint32_t length, uint32_t start)
{
    uint32_t l = 0;

    while (start < length) {
        l = packet[start];

        if (l == 0)
        {
            /* end of parsing*/
            start++;
            break;
        }
        else if ((l & 0xC0) == 0xC0)
        {
            if ((start + 2) > length)
            {
                /* error */
                start = length;
                break;
            }
            else
            {
                start += 2;
                break;
            }
        }
        else if (l > 0x3F)
        {
            /* found an extension. Don't know how to parse it! */
            start = length;
            break;
        }
        else
        {
            /* add a label to the name. */
            if (start + l + 1 > length)
            {
                /* format error */
                start = length;
                break;
            }
            else
            {
                start += l + 1;
            }
        }
    }

    return start;
}